

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variance.c
# Opt level: O1

uint aom_mse8x16_c(uint8_t *a,int a_stride,uint8_t *b,int b_stride,uint32_t *sse)

{
  undefined4 uVar1;
  undefined1 auVar2 [13];
  undefined1 auVar3 [13];
  undefined1 auVar4 [13];
  undefined1 auVar5 [13];
  undefined1 auVar6 [13];
  undefined1 auVar7 [13];
  ulong uVar8;
  ulong uVar9;
  undefined1 auVar10 [13];
  undefined1 auVar11 [13];
  undefined1 auVar12 [12];
  unkbyte10 Var13;
  int iVar14;
  long lVar15;
  int i;
  int iVar16;
  uint uVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  short sVar22;
  undefined1 auVar21 [16];
  undefined1 auVar23 [16];
  
  uVar17 = 0;
  iVar16 = 0;
  do {
    iVar18 = 0;
    iVar19 = 0;
    iVar20 = 0;
    lVar15 = 0;
    do {
      uVar1 = *(undefined4 *)(a + lVar15);
      uVar8 = (ulong)(ushort)uVar1 & 0xffffffffffff00ff;
      auVar2._8_4_ = 0;
      auVar2._0_8_ = uVar8;
      auVar2[0xc] = (char)((uint)uVar1 >> 0x18);
      auVar3[8] = (char)((uint)uVar1 >> 0x10);
      auVar3._0_8_ = uVar8;
      auVar3[9] = 0;
      auVar3._10_3_ = auVar2._10_3_;
      auVar10._5_8_ = 0;
      auVar10._0_5_ = auVar3._8_5_;
      auVar4[4] = (char)((uint)uVar1 >> 8);
      auVar4._0_4_ = (int)uVar8;
      auVar4[5] = 0;
      auVar4._6_7_ = SUB137(auVar10 << 0x40,6);
      uVar1 = *(undefined4 *)(b + lVar15);
      uVar9 = (ulong)(ushort)uVar1 & 0xffffffffffff00ff;
      auVar5._8_4_ = 0;
      auVar5._0_8_ = uVar9;
      auVar5[0xc] = (char)((uint)uVar1 >> 0x18);
      auVar6[8] = (char)((uint)uVar1 >> 0x10);
      auVar6._0_8_ = uVar9;
      auVar6[9] = 0;
      auVar6._10_3_ = auVar5._10_3_;
      auVar11._5_8_ = 0;
      auVar11._0_5_ = auVar6._8_5_;
      auVar7[4] = (char)((uint)uVar1 >> 8);
      auVar7._0_4_ = (int)uVar9;
      auVar7[5] = 0;
      auVar7._6_7_ = SUB137(auVar11 << 0x40,6);
      auVar21._0_4_ = (int)uVar8 - (int)uVar9;
      auVar21._4_4_ = auVar4._4_4_ - auVar7._4_4_;
      auVar21._8_4_ = auVar3._8_4_ - auVar6._8_4_;
      auVar21._12_4_ = (uint)(uint3)(auVar2._10_3_ >> 0x10) - (uint)(uint3)(auVar5._10_3_ >> 0x10);
      auVar21 = packssdw(auVar21,auVar21);
      auVar23 = pmulhw(auVar21,auVar21);
      sVar22 = auVar21._6_2_ * auVar21._6_2_;
      iVar14 = CONCAT22(auVar23._6_2_,sVar22);
      Var13 = CONCAT64(CONCAT42(iVar14,auVar23._4_2_),CONCAT22(auVar21._4_2_ * auVar21._4_2_,sVar22)
                      );
      auVar12._4_8_ = (long)((unkuint10)Var13 >> 0x10);
      auVar12._2_2_ = auVar23._2_2_;
      auVar12._0_2_ = auVar21._2_2_ * auVar21._2_2_;
      uVar17 = uVar17 + CONCAT22(auVar23._0_2_,auVar21._0_2_ * auVar21._0_2_);
      iVar18 = iVar18 + auVar12._0_4_;
      iVar19 = iVar19 + (int)((unkuint10)Var13 >> 0x10);
      iVar20 = iVar20 + iVar14;
      lVar15 = lVar15 + 4;
    } while (lVar15 != 8);
    uVar17 = iVar20 + iVar18 + iVar19 + uVar17;
    a = a + a_stride;
    b = b + b_stride;
    iVar16 = iVar16 + 1;
  } while (iVar16 != 0x10);
  *sse = uVar17;
  return uVar17;
}

Assistant:

void aom_comp_avg_pred_c(uint8_t *comp_pred, const uint8_t *pred, int width,
                         int height, const uint8_t *ref, int ref_stride) {
  int i, j;

  for (i = 0; i < height; ++i) {
    for (j = 0; j < width; ++j) {
      const int tmp = pred[j] + ref[j];
      comp_pred[j] = ROUND_POWER_OF_TWO(tmp, 1);
    }
    comp_pred += width;
    pred += width;
    ref += ref_stride;
  }
}